

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void __thiscall testing::TestCase::AddTestInfo(TestCase *this,TestInfo *test_info)

{
  int local_14;
  TestInfo *local_10;
  
  local_10 = test_info;
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::push_back
            (&this->test_info_list_,&local_10);
  local_14 = (int)((ulong)((long)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->test_indices_,&local_14);
  return;
}

Assistant:

void TestCase::AddTestInfo(TestInfo * test_info) {
  test_info_list_.push_back(test_info);
  test_indices_.push_back(static_cast<int>(test_indices_.size()));
}